

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_object.cpp
# Opt level: O1

void __thiscall JsonObject_Empty_Test::~JsonObject_Empty_Test(JsonObject_Empty_Test *this)

{
  void *in_RAX;
  
  (this->super_JsonObject).super_Test._vptr_Test = (_func_int **)&PTR__JsonObject_001c1880;
  mock_json_callbacks::~mock_json_callbacks
            (&(this->super_JsonObject).callbacks_.super_mock_json_callbacks);
  testing::Mock::UnregisterCallReaction(in_RAX);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x338);
  return;
}

Assistant:

TEST_F (JsonObject, Empty) {
    {
        ::testing::InSequence _;
        EXPECT_CALL (callbacks_, begin_object ()).Times (1);
        EXPECT_CALL (callbacks_, end_object ()).Times (1);
    }
    auto p = json::make_parser (proxy_);
    p.input ("{\r\n}\n"s);
    p.eof ();
    EXPECT_FALSE (p.has_error ());
    EXPECT_EQ (p.coordinate (), (json::coord{1U, 3U}));
}